

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_deep_copy(REF_NODE *ref_node_ptr,REF_MPI ref_mpi,REF_NODE original)

{
  size_t __size;
  int iVar1;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  REF_GLOB RVar4;
  REF_DBL RVar5;
  REF_INT RVar6;
  REF_NODE pRVar7;
  REF_GLOB *pRVar8;
  REF_INT *pRVar9;
  REF_DBL *pRVar10;
  uint uVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  
  pRVar7 = (REF_NODE)malloc(0xa0);
  *ref_node_ptr = pRVar7;
  if (pRVar7 == (REF_NODE)0x0) {
    pcVar17 = "malloc *ref_node_ptr of REF_NODE_STRUCT NULL";
    uVar15 = 0x6c;
    goto LAB_0012b702;
  }
  uVar11 = original->max;
  uVar14 = (ulong)uVar11;
  pRVar7->n = original->n;
  pRVar7->max = uVar11;
  if ((int)uVar11 < 0) {
    pcVar17 = "malloc ref_node->global of REF_GLOB negative";
    uVar15 = 0x74;
    goto LAB_0012b3ed;
  }
  pRVar8 = (REF_GLOB *)malloc(uVar14 * 8);
  pRVar7->global = pRVar8;
  if (pRVar8 == (REF_GLOB *)0x0) {
    pcVar17 = "malloc ref_node->global of REF_GLOB NULL";
    uVar15 = 0x74;
    goto LAB_0012b702;
  }
  pRVar7->blank = original->blank;
  if (uVar14 != 0) {
    pRVar2 = original->global;
    uVar13 = 0;
    do {
      pRVar8[uVar13] = pRVar2[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  pRVar8 = (REF_GLOB *)malloc(uVar14 * 8);
  pRVar7->sorted_global = pRVar8;
  if (pRVar8 == (REF_GLOB *)0x0) {
    pcVar17 = "malloc ref_node->sorted_global of REF_GLOB NULL";
    uVar15 = 0x79;
    goto LAB_0012b702;
  }
  __size = uVar14 * 4;
  pRVar9 = (REF_INT *)malloc(__size);
  pRVar7->sorted_local = pRVar9;
  if (pRVar9 == (REF_INT *)0x0) {
    pcVar17 = "malloc ref_node->sorted_local of REF_INT NULL";
    uVar15 = 0x7a;
    goto LAB_0012b702;
  }
  if (uVar14 != 0) {
    pRVar2 = original->sorted_global;
    uVar13 = 0;
    do {
      pRVar8[uVar13] = pRVar2[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
    if (uVar14 != 0) {
      pRVar3 = original->sorted_local;
      uVar13 = 0;
      do {
        pRVar9[uVar13] = pRVar3[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
  }
  pRVar9 = (REF_INT *)malloc(__size);
  pRVar7->part = pRVar9;
  if (pRVar9 == (REF_INT *)0x0) {
    pcVar17 = "malloc ref_node->part of REF_INT NULL";
    uVar15 = 0x80;
    goto LAB_0012b702;
  }
  if (uVar14 == 0) {
    pRVar9 = (REF_INT *)malloc(__size);
    pRVar7->age = pRVar9;
    if (pRVar9 == (REF_INT *)0x0) goto LAB_0012b61c;
  }
  else {
    pRVar3 = original->part;
    uVar13 = 0;
    do {
      pRVar9[uVar13] = pRVar3[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
    pRVar9 = (REF_INT *)malloc(__size);
    pRVar7->age = pRVar9;
    if (pRVar9 == (REF_INT *)0x0) {
LAB_0012b61c:
      pcVar17 = "malloc ref_node->age of REF_INT NULL";
      uVar15 = 0x84;
      goto LAB_0012b702;
    }
    if (uVar14 != 0) {
      pRVar3 = original->age;
      uVar13 = 0;
      do {
        pRVar9[uVar13] = pRVar3[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
  }
  pRVar10 = (REF_DBL *)malloc(uVar14 * 0x78);
  pRVar7->real = pRVar10;
  if (pRVar10 == (REF_DBL *)0x0) {
    pcVar17 = "malloc ref_node->real of REF_DBL NULL";
    uVar15 = 0x88;
  }
  else {
    if (uVar14 != 0) {
      pRVar12 = original->real;
      uVar13 = 0;
      do {
        lVar16 = 0;
        do {
          pRVar10[lVar16] = pRVar12[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0xf);
        uVar13 = uVar13 + 1;
        pRVar10 = pRVar10 + 0xf;
        pRVar12 = pRVar12 + 0xf;
      } while (uVar13 != uVar14);
    }
    iVar1 = original->naux;
    pRVar7->naux = iVar1;
    pRVar7->aux = (REF_DBL *)0x0;
    if (0 < iVar1) {
      fflush(_stdout);
      uVar11 = pRVar7->max * pRVar7->naux;
      pRVar10 = pRVar7->aux;
      if (0 < (int)uVar11) {
        pRVar10 = (REF_DBL *)realloc(pRVar10,(ulong)uVar11 << 3);
        pRVar7->aux = pRVar10;
      }
      if (pRVar10 == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x91
               ,"ref_node_deep_copy","realloc ref_node->aux NULL");
        uVar14 = (long)pRVar7->max * (long)pRVar7->naux;
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar14 & 0xffffffff,uVar14
               ,8,uVar14 * 8);
        return 2;
      }
      if (uVar14 != 0) {
        uVar11 = pRVar7->naux;
        lVar16 = 0;
        uVar13 = 0;
        do {
          if (0 < (int)uVar11) {
            iVar1 = original->naux;
            pRVar12 = original->aux;
            uVar18 = 0;
            do {
              pRVar10[uVar18] = *(REF_DBL *)((long)pRVar12 + uVar18 * 8 + iVar1 * lVar16);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar13 = uVar13 + 1;
          lVar16 = lVar16 + 8;
          pRVar10 = pRVar10 + (int)uVar11;
        } while (uVar13 != uVar14);
      }
    }
    pRVar7->ref_mpi = ref_mpi;
    uVar11 = original->n_unused;
    pRVar7->n_unused = uVar11;
    iVar1 = original->max_unused;
    pRVar7->max_unused = iVar1;
    if ((long)iVar1 < 0) {
      pcVar17 = "malloc ref_node->unused_global of REF_GLOB negative";
      uVar15 = 0x9b;
LAB_0012b3ed:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar15
             ,"ref_node_deep_copy",pcVar17);
      return 1;
    }
    pRVar8 = (REF_GLOB *)malloc((long)iVar1 << 3);
    pRVar7->unused_global = pRVar8;
    if (pRVar8 != (REF_GLOB *)0x0) {
      if (0 < (int)uVar11) {
        pRVar2 = original->unused_global;
        uVar14 = 0;
        do {
          pRVar8[uVar14] = pRVar2[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      RVar4 = original->new_n_global;
      pRVar7->old_n_global = original->old_n_global;
      pRVar7->new_n_global = RVar4;
      RVar5 = original->min_uv_area;
      pRVar7->min_volume = original->min_volume;
      pRVar7->min_uv_area = RVar5;
      pRVar7->same_normal_tol = original->same_normal_tol;
      RVar6 = original->tri_quality;
      pRVar7->tet_quality = original->tet_quality;
      pRVar7->tri_quality = RVar6;
      pRVar7->ratio_method = original->ratio_method;
      return 0;
    }
    pcVar17 = "malloc ref_node->unused_global of REF_GLOB NULL";
    uVar15 = 0x9b;
  }
LAB_0012b702:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar15,
         "ref_node_deep_copy",pcVar17);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_deep_copy(REF_NODE *ref_node_ptr, REF_MPI ref_mpi,
                                      REF_NODE original) {
  REF_INT max, node, i;
  REF_NODE ref_node;

  ref_malloc(*ref_node_ptr, 1, REF_NODE_STRUCT);
  ref_node = *ref_node_ptr;

  max = ref_node_max(original);

  ref_node_n(ref_node) = ref_node_n(original);
  ref_node_max(ref_node) = max;

  ref_malloc(ref_node->global, max, REF_GLOB);
  ref_node->blank = original->blank;
  for (node = 0; node < max; node++)
    ref_node->global[node] = original->global[node];

  ref_malloc(ref_node->sorted_global, max, REF_GLOB);
  ref_malloc(ref_node->sorted_local, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node->sorted_global[node] = original->sorted_global[node];
  for (node = 0; node < max; node++)
    ref_node->sorted_local[node] = original->sorted_local[node];

  ref_malloc(ref_node->part, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node_part(ref_node, node) = ref_node_part(original, node);

  ref_malloc(ref_node->age, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node_age(ref_node, node) = ref_node_age(original, node);

  ref_malloc(ref_node->real, REF_NODE_REAL_PER * max, REF_DBL);
  for (node = 0; node < max; node++)
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, node) = ref_node_real(original, i, node);

  ref_node_naux(ref_node) = ref_node_naux(original);
  ref_node->aux = NULL;
  if (ref_node_naux(original) > 0) {
    ref_realloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
                REF_DBL);
    for (node = 0; node < max; node++)
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) = ref_node_aux(original, i, node);
  }

  ref_node_mpi(ref_node) = ref_mpi; /* reference only */

  ref_node->n_unused = original->n_unused;
  ref_node->max_unused = original->max_unused;
  ref_malloc(ref_node->unused_global, ref_node_max_unused(ref_node), REF_GLOB);
  for (i = 0; i < ref_node_n_unused(ref_node); i++)
    ref_node->unused_global[i] = original->unused_global[i];

  ref_node->old_n_global = original->old_n_global;
  ref_node->new_n_global = original->new_n_global;

  ref_node->min_volume = original->min_volume;
  ref_node->min_uv_area = original->min_uv_area;
  ref_node->same_normal_tol = original->same_normal_tol;

  ref_node->tet_quality = original->tet_quality;
  ref_node->tri_quality = original->tri_quality;
  ref_node->ratio_method = original->ratio_method;

  return REF_SUCCESS;
}